

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::read_type_and_value
          (basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
           *this,json_visitor *visitor,error_code *ec)

{
  size_t *psVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t b;
  uint8_t local_9;
  
  puVar2 = (this->source_).current_._M_current;
  puVar3 = (this->source_).end_._M_current;
  uVar5 = (ulong)(puVar3 != puVar2);
  if (puVar3 == puVar2) {
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + uVar5;
  }
  else {
    uVar6 = 0;
    puVar4 = puVar2;
    do {
      (this->source_).current_._M_current = puVar4 + 1;
      (&local_9)[uVar6] = *puVar4;
      uVar6 = uVar6 + 1;
      puVar4 = puVar4 + 1;
    } while (uVar5 != uVar6);
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + uVar5;
    if (puVar3 != puVar2) {
      read_value(this,visitor,local_9,ec);
      return;
    }
  }
  std::error_code::operator=(ec,unexpected_eof);
  this->more_ = false;
  return;
}

Assistant:

void read_type_and_value(json_visitor& visitor, std::error_code& ec)
    {
        if (source_.is_error())
        {
            ec = ubjson_errc::source_error;
            more_ = false;
            return;
        }   

        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = ubjson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        read_value(visitor, b, ec);
    }